

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O1

void __thiscall Polynomial::Polynomial(Polynomial *this,int numstates,int numvars)

{
  iterator iVar1;
  int iVar2;
  ulong in_RAX;
  undefined8 local_28;
  
  this->mNumStates = numstates;
  this->mNumVariables = numvars;
  this->mFirstOperation = numvars + numstates;
  *(undefined8 *)&this->mResultLocation = 0;
  *(undefined8 *)
   ((long)&(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mOperands).
           super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->mOperands).
           super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  iVar2 = 0;
  *(undefined4 *)
   ((long)&(this->mOperands).
           super__Vector_base<Polynomial::operand,_std::allocator<Polynomial::operand>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_28 = in_RAX & 0xffffffff00000000;
  if (0 < this->mNumStates) {
    do {
      iVar1._M_current =
           (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->mEvaluationValues,iVar1,
                   (int *)&local_28);
      }
      else {
        *iVar1._M_current = iVar2;
        (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar2 = (int)local_28 + 1;
      local_28 = CONCAT44(local_28._4_4_,iVar2);
    } while (iVar2 < this->mNumStates);
  }
  if (0 < this->mNumVariables) {
    iVar2 = 0;
    do {
      local_28 = local_28 & 0xffffffff;
      iVar1._M_current =
           (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)&this->mEvaluationValues,iVar1,
                   (int *)((long)&local_28 + 4));
      }
      else {
        *iVar1._M_current = 0;
        (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < this->mNumVariables);
  }
  return;
}

Assistant:

Polynomial::Polynomial(int numstates, int numvars)
  : mNumStates(numstates),
    mNumVariables(numvars),
    mFirstOperation(numstates + numvars),
    mResultLocation(0)
{
  for (int i=0; i < mNumStates; ++i)
    mEvaluationValues.push_back(i);
  for (int i=0; i < mNumVariables; ++i)
    mEvaluationValues.push_back(0);
}